

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::TriangleMesh::TriangleMesh(TriangleMesh *this,SP *material)

{
  undefined8 *in_RDI;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffff98;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffffa0;
  box3f *this_00;
  SP *in_stack_ffffffffffffffa8;
  Shape *in_stack_ffffffffffffffb0;
  
  std::shared_ptr<pbrt::Material>::shared_ptr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Shape::Shape(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x1e3432);
  *in_RDI = &PTR_toString_abi_cxx11__0029bc08;
  this_00 = (box3f *)(in_RDI + 0xe);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)0x1e3453);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)0x1e3469);
  std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::vector
            ((vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)0x1e347f);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::vector
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)0x1e3495);
  std::mutex::mutex((mutex *)0x1e34a6);
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  math::box3f::box3f(this_00);
  return;
}

Assistant:

TriangleMesh(Material::SP material=Material::SP()) : Shape(material) {}